

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::base_text::base_text(base_text *this,void **vtt)

{
  long *in_RSI;
  long *in_RDI;
  
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = in_RSI[1];
  std::__cxx11::string::string((string *)(in_RDI + 1));
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0xffffffff;
  *(undefined1 *)(in_RDI + 6) = 1;
  booster::hold_ptr<cppcms::widgets::base_text::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::base_text::_data> *)(in_RDI + 8));
  return;
}

Assistant:

base_text::base_text() : low_(0),high_(-1),validate_charset_(true)
{
}